

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O2

void __thiscall
icu_63::StringCharacterIterator::setText(StringCharacterIterator *this,UnicodeString *newText)

{
  short sVar1;
  int32_t newTextLength;
  ConstChar16Ptr local_28 [3];
  
  UnicodeString::operator=(&this->text,newText);
  local_28[0].p_ = UnicodeString::getBuffer(&this->text);
  sVar1 = (this->text).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    newTextLength = (this->text).fUnion.fFields.fLength;
  }
  else {
    newTextLength = (int)sVar1 >> 5;
  }
  UCharCharacterIterator::setText(&this->super_UCharCharacterIterator,local_28,newTextLength);
  return;
}

Assistant:

void
StringCharacterIterator::setText(const UnicodeString& newText) {
    text = newText;
    UCharCharacterIterator::setText(text.getBuffer(), text.length());
}